

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  container_t *pcVar2;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  int length2;
  int length1;
  uint8_t result_type;
  container_t *in_stack_ffffffffffffff88;
  container_t *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 uVar3;
  uint16_t in_stack_ffffffffffffff9a;
  undefined2 uVar4;
  int32_t in_stack_ffffffffffffff9c;
  int iVar5;
  roaring_array_t *in_stack_ffffffffffffffa0;
  uint8_t type2_00;
  container_t *in_stack_ffffffffffffffa8;
  container_t *in_stack_ffffffffffffffb0;
  uint8_t type1_00;
  container_t *in_stack_ffffffffffffffb8;
  ushort local_2a;
  ushort local_28;
  uint8_t local_26;
  uint8_t local_25;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint8_t local_11;
  roaring_array_t *local_10;
  undefined8 local_8;
  
  local_11 = '\0';
  local_18 = in_RDI->size;
  local_1c = in_RSI->size;
  if (local_1c != 0) {
    if (local_18 == 0) {
      roaring_bitmap_overwrite
                ((roaring_bitmap_t *)in_stack_ffffffffffffffa0,
                 (roaring_bitmap_t *)
                 CONCAT44(in_stack_ffffffffffffff9c,
                          CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)));
    }
    else {
      local_20 = 0;
      local_24 = 0;
      local_10 = in_RSI;
      local_8 = in_RDI;
      local_28 = ra_get_key_at_index(in_RDI,0);
      local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
      while( true ) {
        while (local_28 != local_2a) {
          if (local_28 < local_2a) {
            local_20 = local_20 + 1;
            if (local_20 == local_18) goto LAB_001092f4;
            local_28 = ra_get_key_at_index(local_8,(uint16_t)local_20);
          }
          else {
            in_stack_ffffffffffffffa0 =
                 (roaring_array_t *)ra_get_container_at_index(local_10,(uint16_t)local_24,&local_26)
            ;
            is_cow((roaring_bitmap_t *)local_10);
            in_stack_ffffffffffffffb0 =
                 get_copy_of_container
                           (in_stack_ffffffffffffffa8,(uint8_t *)in_stack_ffffffffffffffa0,
                            SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
            _Var1 = is_cow((roaring_bitmap_t *)local_10);
            if (_Var1) {
              ra_set_container_at_index(local_10,local_24,in_stack_ffffffffffffffb0,local_26);
            }
            ra_insert_new_key_value_at
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff9a
                       ,in_stack_ffffffffffffff90,
                       (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38));
            local_20 = local_20 + 1;
            local_18 = local_18 + 1;
            local_24 = local_24 + 1;
            if (local_24 == local_1c) goto LAB_001092f4;
            local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
          }
        }
        pcVar2 = ra_get_container_at_index(local_8,(uint16_t)local_20,&local_25);
        _Var1 = container_is_full(in_stack_ffffffffffffff88,'\0');
        if (!_Var1) {
          ra_get_container_at_index(local_10,(uint16_t)local_24,&local_26);
          type2_00 = (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
          type1_00 = (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
          if (local_25 == '\x04') {
            in_stack_ffffffffffffffa8 =
                 container_or(in_stack_ffffffffffffffb8,type1_00,in_stack_ffffffffffffffa8,type2_00,
                              (uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff9c,
                                       CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)
                                      ));
          }
          else {
            in_stack_ffffffffffffffa8 =
                 container_ior(in_stack_ffffffffffffffb8,type1_00,in_stack_ffffffffffffffa8,type2_00
                               ,(uint8_t *)
                                CONCAT44(in_stack_ffffffffffffff9c,
                                         CONCAT22(in_stack_ffffffffffffff9a,
                                                  in_stack_ffffffffffffff98)));
          }
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffa8;
          if (in_stack_ffffffffffffffa8 != pcVar2) {
            container_free(in_stack_ffffffffffffff90,
                           (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38));
          }
          ra_set_container_at_index(local_8,local_20,in_stack_ffffffffffffffb8,local_11);
        }
        local_20 = local_20 + 1;
        local_24 = local_24 + 1;
        if ((local_20 == local_18) || (local_24 == local_1c)) break;
        local_28 = ra_get_key_at_index(local_8,(uint16_t)local_20);
        local_2a = ra_get_key_at_index(local_10,(uint16_t)local_24);
      }
LAB_001092f4:
      if (local_20 == local_18) {
        uVar3 = (undefined2)local_24;
        uVar4 = (undefined2)((uint)local_24 >> 0x10);
        iVar5 = local_1c;
        is_cow((roaring_bitmap_t *)local_10);
        ra_append_copy_range
                  (in_stack_ffffffffffffffa0,
                   (roaring_array_t *)CONCAT44(iVar5,CONCAT22(uVar4,uVar3)),
                   (int32_t)((ulong)local_10 >> 0x20),(int32_t)local_10,(_Bool)local_8._7_1_);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}